

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

ssize_t __thiscall
pugi::xml_writer_stream::write(xml_writer_stream *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  
  if (this->narrow_stream != (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
    std::ostream::write((char *)this->narrow_stream,CONCAT44(in_register_00000034,__fd));
    return extraout_RAX;
  }
  std::wostream::write((wchar_t *)this->wide_stream,CONCAT44(in_register_00000034,__fd));
  return extraout_RAX_00;
}

Assistant:

PUGI_IMPL_FN void xml_writer_stream::write(const void* data, size_t size)
	{
		if (narrow_stream)
		{
			assert(!wide_stream);
			narrow_stream->write(reinterpret_cast<const char*>(data), static_cast<std::streamsize>(size));
		}
		else
		{
			assert(wide_stream);
			assert(size % sizeof(wchar_t) == 0);

			wide_stream->write(reinterpret_cast<const wchar_t*>(data), static_cast<std::streamsize>(size / sizeof(wchar_t)));
		}
	}